

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O3

void __thiscall spatial_region::fout_tracks(spatial_region *this,double a,int nm)

{
  pointer pcVar1;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  double *pdVar5;
  double dVar6;
  string file_name;
  char file_num_pchar [20];
  ofstream fout;
  char local_2a1;
  char *local_2a0;
  long local_298;
  char local_290 [16];
  long local_280;
  long local_278;
  undefined8 local_270;
  long local_268;
  long local_260;
  double local_258;
  double local_250;
  char local_248 [24];
  undefined1 *local_230;
  filebuf local_228 [8];
  undefined1 local_220 [232];
  ios_base local_138 [264];
  
  iVar4 = this->nx;
  if (0 < iVar4) {
    dVar6 = (double)nm;
    local_280 = 0;
    local_270 = ___throw_bad_array_new_length;
    iVar2 = this->ny;
    local_268 = _VTT;
    local_258 = dVar6;
    local_250 = a;
    do {
      if (0 < iVar2) {
        iVar4 = this->nz;
        local_278 = 0;
        do {
          if (0 < iVar4) {
            local_260 = 0;
            do {
              pdVar5 = &((this->cp).p._M_t.
                         super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                         super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                         super__Head_base<0UL,_cellp_***,_false>._M_head_impl[local_280][local_278]
                         [local_260].pl.head)->x;
              if (pdVar5 != (double *)0x0) {
                do {
                  if (((*(int *)(pdVar5 + 10) != 0) && (dVar6 <= *pdVar5)) &&
                     (*pdVar5 < (double)(this->nx - nm))) {
                    local_2a0 = local_290;
                    local_230 = local_220;
                    local_298 = 0;
                    local_290[0] = '\0';
                    pcVar1 = (this->data_folder)._M_dataplus._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_230,pcVar1,
                               pcVar1 + (this->data_folder)._M_string_length);
                    std::__cxx11::string::append((char *)&local_230);
                    std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_230);
                    if (local_230 != local_220) {
                      operator_delete(local_230);
                    }
                    sprintf(local_248,"%g",pdVar5[8]);
                    local_230 = local_220;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_230,local_2a0,local_2a0 + local_298);
                    std::__cxx11::string::append((char *)&local_230);
                    std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_230);
                    if (local_230 != local_220) {
                      operator_delete(local_230);
                    }
                    local_230 = local_220;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_230,local_2a0,local_2a0 + local_298);
                    std::__cxx11::string::append((char *)&local_230);
                    std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_230);
                    if (local_230 != local_220) {
                      operator_delete(local_230);
                    }
                    sprintf(local_248,"%d",(ulong)*(uint *)(pdVar5 + 10));
                    local_230 = local_220;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_230,local_2a0,local_2a0 + local_298);
                    std::__cxx11::string::append((char *)&local_230);
                    std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_230);
                    if (local_230 != local_220) {
                      operator_delete(local_230);
                    }
                    std::ofstream::ofstream((string *)&local_230,local_2a0,_S_app);
                    poVar3 = std::ostream::_M_insert<double>(pdVar5[7]);
                    local_2a1 = '\n';
                    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_2a1,1);
                    poVar3 = std::ostream::_M_insert<double>
                                       ((*pdVar5 * this->dx * 0.5) / 3.141592653589793 + local_250);
                    local_2a1 = '\n';
                    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_2a1,1);
                    poVar3 = std::ostream::_M_insert<double>
                                       ((pdVar5[1] * this->dy * 0.5) / 3.141592653589793);
                    local_2a1 = '\n';
                    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_2a1,1);
                    poVar3 = std::ostream::_M_insert<double>
                                       ((pdVar5[2] * this->dz * 0.5) / 3.141592653589793);
                    local_2a1 = '\n';
                    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_2a1,1);
                    poVar3 = std::ostream::_M_insert<double>(pdVar5[3]);
                    local_2a1 = '\n';
                    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_2a1,1);
                    poVar3 = std::ostream::_M_insert<double>(pdVar5[4]);
                    local_2a1 = '\n';
                    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_2a1,1);
                    poVar3 = std::ostream::_M_insert<double>(pdVar5[5]);
                    local_2a1 = '\n';
                    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_2a1,1);
                    poVar3 = std::ostream::_M_insert<double>(pdVar5[6]);
                    local_2a1 = '\n';
                    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_2a1,1);
                    poVar3 = std::ostream::_M_insert<double>(pdVar5[9]);
                    local_2a1 = '\n';
                    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_2a1,1);
                    local_230 = (undefined1 *)local_268;
                    *(undefined8 *)(local_228 + *(long *)(local_268 + -0x18) + -8) = local_270;
                    std::filebuf::~filebuf(local_228);
                    std::ios_base::~ios_base(local_138);
                    dVar6 = local_258;
                    if (local_2a0 != local_290) {
                      operator_delete(local_2a0);
                      dVar6 = local_258;
                    }
                  }
                  pdVar5 = (double *)pdVar5[0xb];
                } while (pdVar5 != (double *)0x0);
                iVar4 = this->nz;
              }
              local_260 = local_260 + 1;
            } while (local_260 < iVar4);
            iVar2 = this->ny;
          }
          local_278 = local_278 + 1;
        } while (local_278 < iVar2);
        iVar4 = this->nx;
      }
      local_280 = local_280 + 1;
    } while (local_280 < iVar4);
  }
  return;
}

Assistant:

void spatial_region::fout_tracks(double a, int nm) {
    for (int i=0;i<nx;i++) {
        for (int j=0;j<ny;j++) {
            for(int k=0;k<nz;k++) {
                particle* current;
                current = cp[i][j][k].pl.head;
                while (current!=0) {
                    if (current->trn!=0 && current->x>=nm && current->x<nx-nm) {
                        std::string file_name;
                        char file_num_pchar[20];
                        file_name = spatial_region::data_folder+"/track_";
                        sprintf(file_num_pchar,"%g",current->cmr);
                        file_name = file_name + file_num_pchar;
                        file_name = file_name + "_";
                        sprintf(file_num_pchar,"%d",current->trn);
                        file_name = file_name + file_num_pchar;
                        ofstream fout(file_name.c_str(),ios::app);
                        #ifdef QUILL_NOQED
                        fout<<current->q<<'\n'<<current->x*dx/2/PI+a<<'\n'<<current->y*dy/2/PI<<'\n'<<current->z*dz/2/PI<<'\n'<<current->ux<<'\n'<<current->uy<<'\n'<<current->uz<<'\n'<<current->g<<'\n'<< 0.0 <<'\n';
                        #else
                        fout<<current->q<<'\n'<<current->x*dx/2/PI+a<<'\n'<<current->y*dy/2/PI<<'\n'<<current->z*dz/2/PI<<'\n'<<current->ux<<'\n'<<current->uy<<'\n'<<current->uz<<'\n'<<current->g<<'\n'<<current->chi<<'\n';
                        #endif
                    }
                    current = current->next;
                }
            }
        }
    }
}